

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O0

int N_VWrmsNormMaskVectorArray_Serial(int nvec,N_Vector *X,N_Vector *W,N_Vector id,realtype *nrm)

{
  int iVar1;
  long lVar2;
  long lVar3;
  long *in_RCX;
  long in_RDX;
  undefined8 *in_RSI;
  int in_EDI;
  realtype *in_R8;
  realtype rVar4;
  realtype *idd;
  realtype *xd;
  realtype *wd;
  sunindextype N;
  sunindextype j;
  int i;
  realtype local_58;
  long lVar5;
  int local_30;
  int local_2c;
  int local_4;
  
  if (in_EDI < 1) {
    local_4 = -1;
  }
  else if (in_EDI == 1) {
    rVar4 = N_VWrmsNormMask_Serial((N_Vector)0x0,(N_Vector)0x0,(N_Vector)0x0);
    *in_R8 = rVar4;
    local_4 = 0;
  }
  else {
    iVar1 = **(int **)*in_RSI;
    lVar5 = *(long *)(*in_RCX + 8);
    for (local_2c = 0; local_2c < in_EDI; local_2c = local_2c + 1) {
      lVar2 = *(long *)(*(long *)in_RSI[local_2c] + 8);
      lVar3 = *(long *)(**(long **)(in_RDX + (long)local_2c * 8) + 8);
      in_R8[local_2c] = 0.0;
      for (local_30 = 0; local_30 < iVar1; local_30 = local_30 + 1) {
        if (0.0 < *(double *)(lVar5 + (long)local_30 * 8)) {
          in_R8[local_2c] =
               *(double *)(lVar2 + (long)local_30 * 8) * *(double *)(lVar3 + (long)local_30 * 8) *
               *(double *)(lVar2 + (long)local_30 * 8) * *(double *)(lVar3 + (long)local_30 * 8) +
               in_R8[local_2c];
        }
      }
      if (0.0 < in_R8[local_2c] / (double)iVar1) {
        local_58 = sqrt(in_R8[local_2c] / (double)iVar1);
      }
      else {
        local_58 = 0.0;
      }
      in_R8[local_2c] = local_58;
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int N_VWrmsNormMaskVectorArray_Serial(int nvec, N_Vector* X, N_Vector* W,
                                      N_Vector id, realtype* nrm)
{
  int          i;
  sunindextype j, N;
  realtype*    wd=NULL;
  realtype*    xd=NULL;
  realtype*    idd=NULL;

  /* invalid number of vectors */
  if (nvec < 1) return(-1);

  /* should have called N_VWrmsNorm */
  if (nvec == 1) {
    nrm[0] = N_VWrmsNormMask_Serial(X[0], W[0], id);
    return(0);
  }

  /* get vector length and mask data array */
  N   = NV_LENGTH_S(X[0]);
  idd = NV_DATA_S(id);

  /* compute the WRMS norm for each vector in the vector array */
  for (i=0; i<nvec; i++) {
    xd = NV_DATA_S(X[i]);
    wd = NV_DATA_S(W[i]);
    nrm[i] = ZERO;
    for (j=0; j<N; j++) {
      if (idd[j] > ZERO)
        nrm[i] += SUNSQR(xd[j] * wd[j]);
    }
    nrm[i] = SUNRsqrt(nrm[i]/N);
  }

  return(0);
}